

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O2

ze_result_t loader::zesInit(ze_init_flags_t flags)

{
  long lVar1;
  int iVar2;
  ze_result_t zVar3;
  bool bVar4;
  driver_t *drv;
  long lVar5;
  
  lVar1 = (*(long **)(context + 0x1610))[1];
  bVar4 = false;
  for (lVar5 = **(long **)(context + 0x1610); lVar5 != lVar1; lVar5 = lVar5 + 0xd98) {
    if ((*(int *)(lVar5 + 8) == 0) && (*(int *)(lVar5 + 0xc) == 0)) {
      if (*(code **)(lVar5 + 0x898) == (code *)0x0) {
        *(undefined4 *)(lVar5 + 0xc) = 0x78000001;
      }
      else {
        iVar2 = (**(code **)(lVar5 + 0x898))(flags);
        *(int *)(lVar5 + 0xc) = iVar2;
        bVar4 = (bool)(bVar4 | iVar2 == 0);
      }
    }
  }
  zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (bVar4) {
    zVar3 = ZE_RESULT_SUCCESS;
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesInit(
        zes_init_flags_t flags                          ///< [in] initialization flags.
                                                        ///< currently unused, must be 0 (default).
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        bool atLeastOneDriverValid = false;
        for( auto& drv : *loader::context->sysmanInstanceDrivers )
        {
            if(drv.initStatus != ZE_RESULT_SUCCESS || drv.initSysManStatus != ZE_RESULT_SUCCESS)
                continue;
            if (!drv.dditable.zes.Global.pfnInit) {
                drv.initSysManStatus = ZE_RESULT_ERROR_UNINITIALIZED;
                continue;
            }
            drv.initSysManStatus = drv.dditable.zes.Global.pfnInit( flags );
            if(drv.initSysManStatus == ZE_RESULT_SUCCESS)
                atLeastOneDriverValid = true;
        }

        if(!atLeastOneDriverValid)
            result=ZE_RESULT_ERROR_UNINITIALIZED;

        return result;
    }